

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O2

void display_columns(menu_conflict *menu,int cursor,int *top,region_conflict *loc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int col;
  int *piVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int pos;
  int iVar10;
  int iVar11;
  int iVar12;
  bool bVar13;
  int h;
  int w;
  
  piVar5 = &menu->filter_count;
  if (menu->filter_list == (int *)0x0) {
    piVar5 = &menu->count;
  }
  iVar1 = *piVar5;
  iVar2 = loc->col;
  iVar3 = loc->row;
  iVar4 = loc->page_rows;
  iVar11 = (iVar1 + iVar4 + -1) / iVar4;
  Term_get_size(&w,&h);
  if (w - iVar2 < iVar11 * 0x17) {
    col = (w - iVar2) / iVar11;
  }
  else {
    col = 0x17;
  }
  iVar10 = 0;
  iVar6 = 0;
  if (0 < iVar4) {
    iVar6 = iVar4;
  }
  if (iVar11 < 1) {
    iVar11 = 0;
  }
  for (iVar8 = 0; iVar8 != iVar11; iVar8 = iVar8 + 1) {
    iVar7 = iVar8 * col;
    pos = iVar10;
    iVar9 = iVar3;
    iVar12 = iVar6;
    while (bVar13 = iVar12 != 0, iVar12 = iVar12 + -1, bVar13) {
      if (pos < iVar1) {
        display_menu_row(menu,pos,(uint)(cursor == pos),SUB41(iVar9,0),iVar7 + iVar2,col,col);
      }
      pos = pos + 1;
      iVar9 = iVar9 + 1;
    }
    iVar10 = iVar10 + iVar4;
  }
  if (-1 < menu->cursor) {
    Term_gotoxy(col * (cursor / iVar4) + iVar2 + menu->cursor_x_offset,
                (iVar3 + cursor % iVar4) - *top);
  }
  return;
}

Assistant:

static void display_columns(struct menu *menu, int cursor, int *top, region *loc)
{
	int c, r;
	int w, h;
	int n = menu->filter_list ? menu->filter_count : menu->count;
	int col = loc->col;
	int row = loc->row;
	int rows_per_page = loc->page_rows;
	int cols = (n + rows_per_page - 1) / rows_per_page;
	int colw = 23;

	Term_get_size(&w, &h);

	if ((colw * cols) > (w - col))
		colw = (w - col) / cols;

	for (c = 0; c < cols; c++) {
		for (r = 0; r < rows_per_page; r++) {
			int pos = c * rows_per_page + r;
			bool is_cursor = (pos == cursor);

			if (pos < n)
				display_menu_row(menu, pos, 0, is_cursor,
						row + r, col + c * colw, colw);
		}
	}

	if (menu->cursor >= 0)
		Term_gotoxy(col + (cursor / rows_per_page) * colw + menu->cursor_x_offset,
				row + (cursor % rows_per_page) - *top);
}